

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

void test_counts(void)

{
  bitset_t *expression;
  bitset_t *bitset;
  int k;
  unsigned_long unaff_retaddr;
  bitset_t *b2;
  bitset_t *b1;
  undefined4 in_stack_ffffffffffffffe8;
  int line;
  
  expression = bitset_create();
  bitset = bitset_create();
  for (line = 0; line < 1000; line = line + 1) {
    bitset_set(bitset,CONCAT44(line,in_stack_ffffffffffffffe8));
    bitset_set(bitset,CONCAT44(line,in_stack_ffffffffffffffe8));
  }
  bitset_intersection_count(b1,b2);
  _assert_true(unaff_retaddr,(char *)expression,(char *)bitset,line);
  bitset_union_count(b1,b2);
  _assert_true(unaff_retaddr,(char *)expression,(char *)bitset,line);
  bitset_free((bitset_t *)0x102e76);
  bitset_free((bitset_t *)0x102e80);
  return;
}

Assistant:

DEFINE_TEST(test_counts) {
    bitset_t *b1 = bitset_create();
    bitset_t *b2 = bitset_create();

    for (int k = 0; k < 1000; ++k) {
        bitset_set(b1, 2 * k);
        bitset_set(b2, 3 * k);
    }
    assert_true(bitset_intersection_count(b1, b2) == 334);
    assert_true(bitset_union_count(b1, b2) == 1666);
    bitset_free(b1);
    bitset_free(b2);
}